

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall Fl_Window::fullscreen_x(Fl_Window *this)

{
  Display *pDVar1;
  int iVar2;
  int y;
  int w;
  int h;
  Window WVar3;
  int local_20;
  int local_1c;
  int right;
  int left;
  int bottom;
  int top;
  Fl_Window *this_local;
  
  iVar2 = Fl_X::ewmh_supported();
  if (iVar2 == 0) {
    Fl_Widget::_set_fullscreen((Fl_Widget *)this);
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[6])();
    (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
    pDVar1 = fl_display;
    WVar3 = fl_xid(this);
    XGrabKeyboard(pDVar1,WVar3,1,1,1,fl_event_time);
    Fl::handle(0x19,this);
  }
  else {
    left = fullscreen_screen_top;
    right = fullscreen_screen_bottom;
    local_1c = fullscreen_screen_left;
    local_20 = fullscreen_screen_right;
    if ((((fullscreen_screen_top < 0) || (fullscreen_screen_bottom < 0)) ||
        (fullscreen_screen_left < 0)) || (fullscreen_screen_right < 0)) {
      iVar2 = Fl_Widget::x((Fl_Widget *)this);
      y = Fl_Widget::y((Fl_Widget *)this);
      w = Fl_Widget::w((Fl_Widget *)this);
      h = Fl_Widget::h((Fl_Widget *)this);
      local_20 = Fl::screen_num(iVar2,y,w,h);
      local_1c = local_20;
      right = local_20;
      left = local_20;
    }
    WVar3 = fl_xid(this);
    send_wm_event(WVar3,fl_NET_WM_FULLSCREEN_MONITORS,(long)left,(long)right,(long)local_1c,
                  (long)local_20,0);
    WVar3 = fl_xid(this);
    send_wm_state_event(WVar3,1,fl_NET_WM_STATE_FULLSCREEN);
  }
  return;
}

Assistant:

void Fl_Window::fullscreen_x() {
  if (Fl_X::ewmh_supported()) {
    int top, bottom, left, right;

    top = fullscreen_screen_top;
    bottom = fullscreen_screen_bottom;
    left = fullscreen_screen_left;
    right = fullscreen_screen_right;

    if ((top < 0) || (bottom < 0) || (left < 0) || (right < 0)) {
      top = Fl::screen_num(x(), y(), w(), h());
      bottom = top;
      left = top;
      right = top;
    }

    send_wm_event(fl_xid(this), fl_NET_WM_FULLSCREEN_MONITORS,
                  top, bottom, left, right);
    send_wm_state_event(fl_xid(this), 1, fl_NET_WM_STATE_FULLSCREEN);
  } else {
    _set_fullscreen();
    hide();
    show();
    /* We want to grab the window, not a widget, so we cannot use Fl::grab */
    XGrabKeyboard(fl_display, fl_xid(this), 1, GrabModeAsync, GrabModeAsync, fl_event_time);
    Fl::handle(FL_FULLSCREEN, this);
  }
}